

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall ezexample::remns(ezexample *this)

{
  size_t sVar1;
  size_t sVar2;
  reference pvVar3;
  features *in_RDI;
  
  sVar1 = v_array<unsigned_char>::size((v_array<unsigned_char> *)(in_RDI->values).erase_count);
  if (sVar1 == 0) {
    *(undefined4 *)&(in_RDI->space_names)._begin = 0;
    *(undefined1 *)((long)&(in_RDI->space_names).end_array + 4) = 0;
  }
  else {
    if ((*(byte *)((long)&(in_RDI->space_names).end_array +
                  (long)(int)*(char *)((long)&(in_RDI->space_names).end_array + 4) + 5) & 1) != 0) {
      sVar1 = (in_RDI->values).erase_count;
      *(float *)(sVar1 + 0x68b4) =
           *(float *)(sVar1 + 0x68b4) -
           *(float *)((in_RDI->values).erase_count +
                      (long)(int)*(char *)((long)&(in_RDI->space_names).end_array + 4) * 0x68 + 0x80
                     );
      features::clear(in_RDI);
      sVar2 = features::size((features *)0x11cc4f);
      sVar1 = (in_RDI->values).erase_count;
      *(size_t *)(sVar1 + 0x68a0) = *(long *)(sVar1 + 0x68a0) - sVar2;
      *(undefined1 *)
       ((long)&(in_RDI->space_names).end_array +
       (long)(int)*(char *)((long)&(in_RDI->space_names).end_array + 4) + 5) = 0;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
    *(value_type *)&(in_RDI->space_names)._begin = *pvVar3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11cc99);
    v_array<unsigned_char>::pop((v_array<unsigned_char> *)(in_RDI->values).erase_count);
    *(undefined1 *)((long)&in_RDI[3].values.erase_count + 5) = 1;
  }
  return;
}

Assistant:

void remns()
  {
    if (ec->indices.size() == 0)
    {
      current_seed = 0;
      current_ns = 0;
    }
    else
    {
      if (ns_exists[(int)current_ns])
      {
        ec->total_sum_feat_sq -= ec->feature_space[(int)current_ns].sum_feat_sq;
        ec->feature_space[(int)current_ns].clear();
        ec->num_features -= ec->feature_space[(int)current_ns].size();

        ns_exists[(int)current_ns] = false;
      }

      current_seed = past_seeds.back();
      past_seeds.pop_back();
      ec->indices.pop();
      example_changed_since_prediction = true;
    }
  }